

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_eval.cc
# Opt level: O3

void EXPLORE_EVAL::output_example(vw *all,explore_eval *c,example *ec,multi_ex *ec_seq)

{
  v_array<char> *pvVar1;
  polyprediction *a_s;
  int iVar2;
  action_score *paVar3;
  int *piVar4;
  wclass *pwVar5;
  _func_void_int_string_v_array<char> *p_Var6;
  v_array<char> vVar7;
  bool bVar8;
  ulong uVar9;
  ostream *poVar10;
  pointer ppeVar11;
  size_t num_features;
  long lVar12;
  ulong uVar13;
  int *piVar14;
  long lVar15;
  float *pfVar16;
  float loss;
  float fVar17;
  string outputString;
  stringstream outputStringStream;
  undefined7 in_stack_fffffffffffffde8;
  char in_stack_fffffffffffffdef;
  vw *all_00;
  undefined4 in_stack_fffffffffffffe00;
  float fVar18;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  if ((((ec->tag)._end != (ec->tag)._begin) ||
      ((ec->super_example_predict).indices._end != (ec->super_example_predict).indices._begin)) ||
     (bVar8 = CB::ec_is_example_header(ec), bVar8)) {
    ppeVar11 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    paVar3 = ((*ppeVar11)->pred).a_s._begin;
    pfVar16 = ((*ppeVar11)->pred).scalars._end;
    if ((ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
        super__Vector_impl_data._M_finish == ppeVar11) {
      uVar9 = 0;
      num_features = 0;
    }
    else {
      num_features = 0;
      uVar13 = 0;
      do {
        bVar8 = CB::ec_is_example_header(ppeVar11[uVar13]);
        ppeVar11 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        if (!bVar8) {
          num_features = num_features + ppeVar11[uVar13]->num_features;
        }
        uVar13 = uVar13 + 1;
        uVar9 = (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppeVar11 >> 3;
      } while (uVar13 < uVar9);
    }
    fVar18 = (c->known_cost).probability;
    loss = 0.0;
    bVar8 = 0.0 < fVar18;
    if ((0.0 < fVar18) && (lVar15 = (long)pfVar16 - (long)paVar3, lVar15 != 0)) {
      uVar13 = 0;
      do {
        fVar17 = (c->known_cost).cost / fVar18;
        if ((c->known_cost).action != paVar3[uVar13].action) {
          fVar17 = 0.0;
        }
        loss = loss + fVar17 * paVar3[uVar13].score;
        uVar13 = uVar13 + 1;
      } while ((uVar13 & 0xffffffff) < (ulong)(lVar15 >> 3));
    }
    if (uVar9 != 0) {
      uVar13 = 0;
      do {
        bVar8 = (bool)(bVar8 & ppeVar11[uVar13]->test_only);
        uVar13 = uVar13 + 1;
      } while (uVar9 != uVar13);
    }
    pvVar1 = &ec->tag;
    all_00 = all;
    shared_data::update(all->sd,bVar8,0.0 < fVar18,loss,ec->weight,num_features);
    piVar14 = (all->final_prediction_sink)._begin;
    piVar4 = (all->final_prediction_sink)._end;
    if (piVar14 != piVar4) {
      a_s = &ec->pred;
      do {
        ACTION_SCORE::print_action_score
                  (*piVar14,(v_array<ACTION_SCORE::action_score> *)&a_s->scalars,pvVar1);
        piVar14 = piVar14 + 1;
      } while (piVar14 != piVar4);
    }
    if (0 < all_00->raw_prediction) {
      local_1f8 = local_1e8;
      local_1f0 = 0;
      local_1e8[0] = 0;
      std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_1f8,_S_out|_S_in);
      pwVar5 = (ec->l).cs.costs._begin;
      lVar15 = (long)(ec->l).cs.costs._end - (long)pwVar5;
      if (lVar15 != 0) {
        lVar15 = lVar15 >> 4;
        pfVar16 = &pwVar5->wap_value;
        lVar12 = 0;
        do {
          if (lVar12 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,&stack0xfffffffffffffdef,1);
          }
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          in_stack_fffffffffffffdef = ':';
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,&stack0xfffffffffffffdef,1);
          std::ostream::_M_insert<double>((double)*pfVar16);
          lVar12 = lVar12 + 1;
          pfVar16 = pfVar16 + 4;
        } while (lVar15 + (ulong)(lVar15 == 0) != lVar12);
      }
      p_Var6 = all_00->print_text;
      iVar2 = all_00->raw_prediction;
      std::__cxx11::stringbuf::str();
      vVar7._begin._7_1_ = in_stack_fffffffffffffdef;
      vVar7._begin._0_7_ = in_stack_fffffffffffffde8;
      vVar7._end = (char *)ec;
      vVar7.end_array = (char *)all_00;
      vVar7.erase_count._0_4_ = in_stack_fffffffffffffe00;
      vVar7.erase_count._4_4_ = fVar18;
      (*p_Var6)(iVar2,(string)*pvVar1,vVar7);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8);
      }
    }
    CB::print_update(all_00,fVar18 <= 0.0,ec,ec_seq,true);
  }
  return;
}

Assistant:

void output_example(vw& all, explore_eval& c, example& ec, multi_ex* ec_seq)
{
  if (example_is_newline_not_header(ec))
    return;

  size_t num_features = 0;

  float loss = 0.;
  ACTION_SCORE::action_scores preds = (*ec_seq)[0]->pred.a_s;

  for (size_t i = 0; i < (*ec_seq).size(); i++)
    if (!CB::ec_is_example_header(*(*ec_seq)[i]))
      num_features += (*ec_seq)[i]->num_features;

  bool labeled_example = true;
  if (c.known_cost.probability > 0)
  {
    for (uint32_t i = 0; i < preds.size(); i++)
    {
      float l = get_unbiased_cost(&c.known_cost, preds[i].action);
      loss += l * preds[i].score;
    }
  }
  else
    labeled_example = false;

  bool holdout_example = labeled_example;
  for (size_t i = 0; i < ec_seq->size(); i++) holdout_example &= (*ec_seq)[i]->test_only;

  all.sd->update(holdout_example, labeled_example, loss, ec.weight, num_features);

  for (int sink : all.final_prediction_sink) print_action_score(sink, ec.pred.a_s, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    v_array<CB::cb_class> costs = ec.l.cb.costs;

    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].action << ':' << costs[i].partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  CB::print_update(all, !labeled_example, ec, ec_seq, true);
}